

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plurfmt.cpp
# Opt level: O1

UnicodeString * __thiscall
icu_63::PluralFormat::toPattern(PluralFormat *this,UnicodeString *appendTo)

{
  short sVar1;
  int32_t srcLength;
  
  if ((this->msgPattern).partsLength == 0) {
    UnicodeString::setToBogus(appendTo);
  }
  else {
    sVar1 = (this->msgPattern).msg.fUnion.fStackFields.fLengthAndFlags;
    if (sVar1 < 0) {
      srcLength = (this->msgPattern).msg.fUnion.fFields.fLength;
    }
    else {
      srcLength = (int)sVar1 >> 5;
    }
    UnicodeString::doAppend(appendTo,&(this->msgPattern).msg,0,srcLength);
  }
  return appendTo;
}

Assistant:

UnicodeString&
PluralFormat::toPattern(UnicodeString& appendTo) {
    if (0 == msgPattern.countParts()) {
        appendTo.setToBogus();
    } else {
        appendTo.append(msgPattern.getPatternString());
    }
    return appendTo;
}